

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BroadcastReceiver.h
# Opt level: O3

void __thiscall
aeron::concurrent::broadcast::BroadcastReceiver::BroadcastReceiver
          (BroadcastReceiver *this,AtomicBuffer *buffer)

{
  char *pcVar1;
  length_t lVar2;
  int64_t iVar3;
  SourcedException *this_00;
  char *pcVar4;
  size_t sVar5;
  uint __val;
  char *pcVar6;
  string local_a8;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this->m_buffer = buffer;
  lVar2 = buffer->m_length;
  __val = lVar2 - 0x80;
  this->m_capacity = __val;
  this->m_mask = lVar2 - 0x81;
  this->m_tailIntentCounterIndex = __val;
  this->m_tailCounterIndex = lVar2 - 0x78;
  this->m_latestCounterIndex = lVar2 - 0x70;
  *(undefined8 *)&this->m_recordOffset = 0;
  *(undefined8 *)((long)&this->m_cursor + 4) = 0;
  this->m_nextRecord = 0;
  (this->m_lappedCount).super___atomic_base<long>._M_i = 0;
  if ((0x80 < (int)lVar2) && ((lVar2 + 0x7fffff7f & __val) == 0)) {
    iVar3 = *(int64_t *)(buffer->m_buffer + (lVar2 - 0x70));
    this->m_cursor = iVar3;
    this->m_nextRecord = iVar3;
    this->m_recordOffset = lVar2 - 0x81 & (uint)iVar3;
    return;
  }
  this_00 = (SourcedException *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_68,__val);
  std::operator+(&local_48,"capacity must be a positive power of 2 + TRAILER_LENGTH: capacity=",
                 &local_68);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,
             "void aeron::concurrent::broadcast::BroadcastBufferDescriptor::checkCapacity(util::index_t)"
             ,"");
  pcVar6 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/broadcast/BroadcastBufferDescriptor.h"
  ;
  pcVar4 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
  do {
    pcVar4 = pcVar4 + 1;
    pcVar1 = pcVar6 + 1;
    pcVar6 = pcVar6 + 1;
  } while (*pcVar4 == *pcVar1);
  pcVar6 = pcVar6 + (*pcVar1 == '/');
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  sVar5 = strlen(pcVar6);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,pcVar6,pcVar6 + sVar5);
  util::SourcedException::SourcedException(this_00,&local_48,&local_88,&local_a8,0x27);
  *(undefined ***)this_00 = &PTR__SourcedException_00162b00;
  __cxa_throw(this_00,&util::IllegalStateException::typeinfo,
              util::SourcedException::~SourcedException);
}

Assistant:

BroadcastReceiver(AtomicBuffer& buffer) :
        m_buffer(buffer),
        m_capacity(buffer.capacity() - BroadcastBufferDescriptor::TRAILER_LENGTH),
        m_mask(m_capacity - 1),
        m_tailIntentCounterIndex(m_capacity + BroadcastBufferDescriptor::TAIL_INTENT_COUNTER_OFFSET),
        m_tailCounterIndex(m_capacity + BroadcastBufferDescriptor::TAIL_COUNTER_OFFSET),
        m_latestCounterIndex(m_capacity + BroadcastBufferDescriptor::LATEST_COUNTER_OFFSET),
        m_recordOffset(0),
        m_cursor(0),
        m_nextRecord(0),
        m_lappedCount(0)
    {
        BroadcastBufferDescriptor::checkCapacity(m_capacity);

        m_cursor = m_buffer.getInt64(m_latestCounterIndex);
        m_nextRecord = m_cursor;
        m_recordOffset = (std::int32_t)m_cursor & m_mask;
    }